

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O0

void __thiscall
DirectiveObjImport::DirectiveObjImport
          (DirectiveObjImport *this,path *inputName,Identifier *ctorName)

{
  int iVar1;
  _Head_base<0UL,_IElfRelocator_*,_false> local_20;
  Identifier *ctorName_local;
  path *inputName_local;
  DirectiveObjImport *this_local;
  
  local_20._M_head_impl = (IElfRelocator *)ctorName;
  ctorName_local = (Identifier *)inputName;
  inputName_local = (path *)this;
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__DirectiveObjImport_002aa1b8;
  ElfRelocator::ElfRelocator(&this->rel);
  std::unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>>::
  unique_ptr<std::default_delete<CAssemblerCommand>,void>
            ((unique_ptr<CAssemblerCommand,std::default_delete<CAssemblerCommand>> *)&this->ctor);
  iVar1 = ElfRelocator::init(&this->rel,(EVP_PKEY_CTX *)ctorName_local);
  (this->super_CAssemblerCommand).field_0x14 = (byte)iVar1 & 1;
  if (((this->super_CAssemblerCommand).field_0x14 & 1) != 0) {
    ElfRelocator::exportSymbols(&this->rel);
    ElfRelocator::generateCtor((ElfRelocator *)&stack0xffffffffffffffc8,(Identifier *)&this->rel);
    std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::operator=
              (&this->ctor,
               (unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)
               &stack0xffffffffffffffc8);
    std::unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>::~unique_ptr
              ((unique_ptr<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_> *)
               &stack0xffffffffffffffc8);
  }
  return;
}

Assistant:

DirectiveObjImport::DirectiveObjImport(const fs::path& inputName, const Identifier& ctorName)
{
	success = rel.init(inputName);
	if (success)
	{
		rel.exportSymbols();
		ctor = rel.generateCtor(ctorName);
	}
}